

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall Application::onMessage(Application *this)

{
  SessionID *in_RDX;
  MarketDataRequest *in_RSI;
  
  onMessage((Application *)
            &this[-1].m_orderMatcher.m_markets._M_t._M_impl.super__Rb_tree_header._M_node_count,
            in_RSI,in_RDX);
  return;
}

Assistant:

void Application::onMessage(const FIX42::MarketDataRequest &message, const FIX::SessionID &) {
  FIX::MDReqID mdReqID;
  FIX::SubscriptionRequestType subscriptionRequestType;
  FIX::MarketDepth marketDepth;
  FIX::NoRelatedSym noRelatedSym;
  FIX42::MarketDataRequest::NoRelatedSym noRelatedSymGroup;

  message.get(mdReqID);
  message.get(subscriptionRequestType);
  if (subscriptionRequestType != FIX::SubscriptionRequestType_SNAPSHOT) {
    throw FIX::IncorrectTagValue(subscriptionRequestType.getTag());
  }
  message.get(marketDepth);
  message.get(noRelatedSym);

  for (int i = 1; i <= noRelatedSym; ++i) {
    FIX::Symbol symbol;
    message.getGroup(i, noRelatedSymGroup);
    noRelatedSymGroup.get(symbol);
  }
}